

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O0

double bup(double *a,double *b,double *x,double *y,int *n,double *eps)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double *eps_local;
  int *n_local;
  double *y_local;
  double *x_local;
  double *b_local;
  double *a_local;
  
  bup::apb = *a + *b;
  bup::ap1 = *a + 1.0;
  bup::mu = 0;
  bup::d = 1.0;
  if (((*n != 1) && (1.0 < *a || *a == 1.0)) && (bup::ap1 * 1.1 <= bup::apb)) {
    dVar2 = exparg(&bup::K1);
    bup::mu = (int)ABS(dVar2);
    dVar2 = exparg(&bup::K2);
    bup::k = (int)dVar2;
    if (bup::k < bup::mu) {
      bup::mu = bup::k;
    }
    bup::t = (double)bup::mu;
    bup::d = exp(-bup::t);
  }
  dVar2 = brcmp1(&bup::mu,a,b,x,y);
  dVar2 = dVar2 / *a;
  if (*n == 1) {
    bup::bup = dVar2;
    return dVar2;
  }
  if ((dVar2 == 0.0) && (!NAN(dVar2))) {
    bup::bup = dVar2;
    return dVar2;
  }
  bup::nm1 = *n + -1;
  bup::w = bup::d;
  bup::k = 0;
  if (1.0 < *b) {
    iVar1 = bup::nm1;
    if (0.0001 < *y) {
      bup::r = ((*b - 1.0) * *x) / *y - *a;
      if (bup::r < 1.0) goto LAB_00109f82;
      bup::t = (double)bup::nm1;
      dVar3 = bup::t;
      if (bup::r < bup::t) {
        dVar3 = bup::r;
      }
      bup::k = (int)dVar3;
      iVar1 = bup::k;
    }
    bup::k = iVar1;
    for (bup::i = 1; bup::i <= bup::k; bup::i = bup::i + 1) {
      bup::l = (double)(bup::i + -1);
      bup::d = ((bup::apb + bup::l) / (bup::ap1 + bup::l)) * *x * bup::d;
      bup::w = bup::d + bup::w;
    }
    if (bup::k == bup::nm1) goto LAB_0010a050;
  }
LAB_00109f82:
  bup::kp1 = bup::k + 1;
  for (bup::i = bup::kp1; bup::i <= bup::nm1; bup::i = bup::i + 1) {
    bup::l = (double)(bup::i + -1);
    bup::d = ((bup::apb + bup::l) / (bup::ap1 + bup::l)) * *x * bup::d;
    bup::w = bup::d + bup::w;
    if (bup::d <= *eps * bup::w) break;
  }
LAB_0010a050:
  a_local = (double *)(bup::w * dVar2);
  bup::bup = (double)a_local;
  return bup::w * dVar2;
}

Assistant:

double bup(double *a,double *b,double *x,double *y,int *n,double *eps)
/*
-----------------------------------------------------------------------
     EVALUATION OF IX(A,B) - IX(A+N,B) WHERE N IS A POSITIVE INTEGER.
     EPS IS THE TOLERANCE USED.
-----------------------------------------------------------------------
*/
{
static int K1 = 1;
static int K2 = 0;
static double bup,ap1,apb,d,l,r,t,w;
static int i,k,kp1,mu,nm1;
/*
     ..
     .. Executable Statements ..
*/
/*
          OBTAIN THE SCALING FACTOR EXP(-MU) AND
             EXP(MU)*(X**A*Y**B/BETA(A,B))/A
*/
    apb = *a+*b;
    ap1 = *a+1.0e0;
    mu = 0;
    d = 1.0e0;
    if(*n == 1 || *a < 1.0e0) goto S10;
    if(apb < 1.1e0*ap1) goto S10;
    mu = fabs(exparg(&K1));
    k = exparg(&K2);
    if(k < mu) mu = k;
    t = mu;
    d = exp(-t);
S10:
    bup = brcmp1(&mu,a,b,x,y)/ *a;
    if(*n == 1 || bup == 0.0e0) return bup;
    nm1 = *n-1;
    w = d;
/*
          LET K BE THE INDEX OF THE MAXIMUM TERM
*/
    k = 0;
    if(*b <= 1.0e0) goto S50;
    if(*y > 1.e-4) goto S20;
    k = nm1;
    goto S30;
S20:
    r = (*b-1.0e0)**x/ *y-*a;
    if(r < 1.0e0) goto S50;
    k = t = nm1;
    if(r < t) k = r;
S30:
/*
          ADD THE INCREASING TERMS OF THE SERIES
*/
    for(i=1; i<=k; i++) {
        l = i-1;
        d = (apb+l)/(ap1+l)**x*d;
        w += d;
    }
    if(k == nm1) goto S70;
S50:
/*
          ADD THE REMAINING TERMS OF THE SERIES
*/
    kp1 = k+1;
    for(i=kp1; i<=nm1; i++) {
        l = i-1;
        d = (apb+l)/(ap1+l)**x*d;
        w += d;
        if(d <= *eps*w) goto S70;
    }
S70:
/*
               TERMINATE THE PROCEDURE
*/
    bup *= w;
    return bup;
}